

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall cmGlobalUnixMakefileGenerator3::Generate(cmGlobalUnixMakefileGenerator3 *this)

{
  bool bVar1;
  reference ppVar2;
  LocalGeneratorVector *this_00;
  pointer this_01;
  string *str;
  type lg_00;
  size_t sVar3;
  ostream *poVar4;
  type pcVar5;
  undefined1 local_368 [8];
  cmGeneratedFileStream markFile;
  cmAlphaNum local_d0;
  undefined1 local_a0 [8];
  string markFileName;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  iterator __end1_2;
  iterator __begin1_2;
  LocalGeneratorVector *__range1_2;
  pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress> *pmi_1;
  iterator __end1_1;
  iterator __begin1_1;
  ProgressMapType *__range1_1;
  unsigned_long current;
  pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress> *pmi;
  iterator __end1;
  iterator __begin1;
  ProgressMapType *__range1;
  unsigned_long total;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  cmGlobalGenerator::Generate((cmGlobalGenerator *)this);
  __range1 = (ProgressMapType *)0x0;
  __end1 = std::
           map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
           ::begin(&this->ProgressMap);
  pmi = (pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress> *)
        std::
        map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
        ::end(&this->ProgressMap);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&pmi), bVar1) {
    current = (unsigned_long)
              std::
              _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
              ::operator*(&__end1);
    __range1 = (ProgressMapType *)
               (&(__range1->_M_t)._M_impl.field_0x0 + (((reference)current)->second).NumberOfActions
               );
    std::
    _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
    ::operator++(&__end1);
  }
  __range1_1 = (ProgressMapType *)0x0;
  __end1_1 = std::
             map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
             ::begin(&this->ProgressMap);
  pmi_1 = (pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress> *)
          std::
          map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
          ::end(&this->ProgressMap);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&pmi_1), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
             ::operator*(&__end1_1);
    TargetProgress::WriteProgressVariables
              (&ppVar2->second,(unsigned_long)__range1,(unsigned_long *)&__range1_1);
    std::
    _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>
    ::operator++(&__end1_1);
  }
  this_00 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
  __end1_2 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::begin(this_00);
  lg = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                             *)&lg), bVar1) {
    markFileName.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
         ::operator*(&__end1_2);
    this_01 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                        ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                         markFileName.field_2._8_8_);
    str = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_01);
    cmAlphaNum::cmAlphaNum(&local_d0,str);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&markFile.field_0x260,"/CMakeFiles/progress.marks");
    cmStrCat<>((string *)local_a0,&local_d0,(cmAlphaNum *)&markFile.field_0x260);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_368,(string *)local_a0,false,None);
    lg_00 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator*
                      ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
                       markFileName.field_2._8_8_);
    sVar3 = CountProgressMarksInAll(this,lg_00);
    poVar4 = (ostream *)std::ostream::operator<<(local_368,sVar3);
    std::operator<<(poVar4,"\n");
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_368);
    std::__cxx11::string::~string((string *)local_a0);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1_2);
  }
  WriteMainMakefile2(this);
  WriteMainCMakefile(this);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->CommandDatabase);
  if (bVar1) {
    pcVar5 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->CommandDatabase);
    std::operator<<((ostream *)pcVar5,"\n]");
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::reset
              (&this->CommandDatabase,(pointer)0x0);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Generate()
{
  // first do superclass method
  this->cmGlobalGenerator::Generate();

  // initialize progress
  unsigned long total = 0;
  for (auto const& pmi : this->ProgressMap) {
    total += pmi.second.NumberOfActions;
  }

  // write each target's progress.make this loop is done twice. Basically the
  // Generate pass counts all the actions, the first loop below determines
  // how many actions have progress updates for each target and writes to
  // correct variable values for everything except the all targets. The
  // second loop actually writes out correct values for the all targets as
  // well. This is because the all targets require more information that is
  // computed in the first loop.
  unsigned long current = 0;
  for (auto& pmi : this->ProgressMap) {
    pmi.second.WriteProgressVariables(total, current);
  }
  for (const auto& lg : this->LocalGenerators) {
    std::string markFileName =
      cmStrCat(lg->GetCurrentBinaryDirectory(), "/CMakeFiles/progress.marks");
    cmGeneratedFileStream markFile(markFileName);
    markFile << this->CountProgressMarksInAll(*lg) << "\n";
  }

  // write the main makefile
  this->WriteMainMakefile2();
  this->WriteMainCMakefile();

  if (this->CommandDatabase) {
    *this->CommandDatabase << "\n]";
    this->CommandDatabase.reset();
  }
}